

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall
SynthWidget::refreshAudioDeviceList(SynthWidget *this,Master *master,AudioDevice *useAudioDevice)

{
  QComboBox *this_00;
  QPushButton *pQVar1;
  bool bVar2;
  AudioDevice **ppAVar3;
  AudioDevice **value;
  QObject local_d0 [8];
  enable_if_t<std::is_copy_constructible_v<const_AudioDevice_*>,_QVariant> local_c8;
  QString local_a8;
  QString local_90;
  undefined1 local_78 [8];
  AudioDevice *audioDevice;
  QList<const_AudioDevice_*> local_60;
  undefined1 local_48 [8];
  QListIterator<const_AudioDevice_*> audioDeviceIt;
  int audioDeviceIndex;
  AudioDevice *useAudioDevice_local;
  Master *master_local;
  SynthWidget *this_local;
  
  QObject::disconnect((QObject *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,
                      "2currentIndexChanged(int)",(QObject *)this,
                      "1on_audioDeviceComboBox_currentIndexChanged(int)");
  QComboBox::clear();
  audioDeviceIt.i.i._4_4_ = 0;
  Master::getAudioDevices(&local_60,master);
  QListIterator<const_AudioDevice_*>::QListIterator
            ((QListIterator<const_AudioDevice_*> *)local_48,&local_60);
  QList<const_AudioDevice_*>::~QList(&local_60);
  while (bVar2 = QListIterator<const_AudioDevice_*>::hasNext
                           ((QListIterator<const_AudioDevice_*> *)local_48), bVar2) {
    ppAVar3 = QListIterator<const_AudioDevice_*>::next
                        ((QListIterator<const_AudioDevice_*> *)local_48);
    local_78 = (undefined1  [8])*ppAVar3;
    this_00 = (this->ui->super_Ui_SynthWidget).audioDeviceComboBox;
    ::operator+(&local_a8,&((AudioDevice *)local_78)->driver->name,": ");
    ::operator+(&local_90,&local_a8,(QString *)((long)local_78 + 0x10));
    QVariant::fromValue<AudioDevice_const*>(&local_c8,(QVariant *)local_78,value);
    QComboBox::addItem(this_00,&local_90,&local_c8);
    QVariant::~QVariant(&local_c8);
    QString::~QString(&local_90);
    QString::~QString(&local_a8);
    if (((useAudioDevice != (AudioDevice *)0x0) &&
        (bVar2 = ::operator==(&useAudioDevice->driver->id,
                              &(*(AudioDriver **)((long)local_78 + 8))->id), bVar2)) &&
       (bVar2 = ::operator==(&useAudioDevice->name,(QString *)((long)local_78 + 0x10)), bVar2)) {
      QComboBox::setCurrentIndex((int)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox);
    }
    audioDeviceIt.i.i._4_4_ = audioDeviceIt.i.i._4_4_ + 1;
  }
  pQVar1 = (this->ui->super_Ui_SynthWidget).audioPropertiesButton;
  QComboBox::count();
  QWidget::setEnabled(SUB81(pQVar1,0));
  QObject::connect(local_d0,(int)this,
                   (sockaddr *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,0x1c9571);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QListIterator<const_AudioDevice_*>::~QListIterator((QListIterator<const_AudioDevice_*> *)local_48)
  ;
  return;
}

Assistant:

void SynthWidget::refreshAudioDeviceList(Master *master, const AudioDevice *useAudioDevice) {
	disconnect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), this, SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
	ui->audioDeviceComboBox->clear();
	int audioDeviceIndex = 0;
	QListIterator<const AudioDevice *> audioDeviceIt(master->getAudioDevices());
	while(audioDeviceIt.hasNext()) {
		const AudioDevice *audioDevice = audioDeviceIt.next();
		ui->audioDeviceComboBox->addItem(audioDevice->driver.name + ": " + audioDevice->name, QVariant::fromValue(audioDevice));
		if (useAudioDevice != NULL && useAudioDevice->driver.id == audioDevice->driver.id
				&& useAudioDevice->name == audioDevice->name) ui->audioDeviceComboBox->setCurrentIndex(audioDeviceIndex);
		audioDeviceIndex++;
	}
	ui->audioPropertiesButton->setEnabled(ui->audioDeviceComboBox->count() != 0);
	connect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
}